

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O2

void __thiscall
IntegerCompressor::IntegerCompressor
          (IntegerCompressor *this,ArithmeticDecoder *dec,U32 bits,U32 contexts,U32 bits_high,
          U32 range)

{
  U32 UVar1;
  int iVar2;
  U32 UVar3;
  uint uVar4;
  
  if (dec != (ArithmeticDecoder *)0x0) {
    this->enc = (ArithmeticEncoder *)0x0;
    this->dec = dec;
    this->bits = bits;
    this->contexts = contexts;
    this->bits_high = bits_high;
    this->range = range;
    if (range == 0) {
      if (bits - 1 < 0x1f) {
        this->corr_bits = bits;
        uVar4 = 1 << ((byte)bits & 0x1f);
        this->corr_range = uVar4;
        this->corr_min = -(uVar4 >> 1);
        iVar2 = ~(uVar4 >> 1) + uVar4;
      }
      else {
        this->corr_bits = 0x20;
        this->corr_range = 0;
        this->corr_min = -0x80000000;
        iVar2 = 0x7fffffff;
      }
    }
    else {
      this->corr_range = range;
      UVar3 = 0xffffffff;
      for (UVar1 = range; UVar1 != 0; UVar1 = UVar1 >> 1) {
        UVar3 = UVar3 + 1;
      }
      UVar1 = UVar3 + 1;
      if (1 << ((byte)UVar3 & 0x1f) == range) {
        UVar1 = UVar3;
      }
      this->corr_bits = UVar1;
      this->corr_min = -(range >> 1);
      iVar2 = ~(range >> 1) + range;
    }
    this->corr_max = iVar2;
    this->k = 0;
    this->mBits = (ArithmeticModel **)0x0;
    this->mCorrector = (ArithmeticModel **)0x0;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/integercompressor.cpp"
                ,0x6f,
                "IntegerCompressor::IntegerCompressor(ArithmeticDecoder *, U32, U32, U32, U32)");
}

Assistant:

IntegerCompressor::IntegerCompressor(ArithmeticDecoder* dec, U32 bits, U32 contexts, U32 bits_high, U32 range)
{
  assert(dec);
  this->enc = 0;
  this->dec = dec;
  this->bits = bits;
  this->contexts = contexts;
  this->bits_high = bits_high;
  this->range = range;

  if (range) // the corrector's significant bits and range
  {
    corr_bits = 0;
    corr_range = range;
    while (range)
    {
      range = range >> 1;
      corr_bits++;
    }
    if (corr_range == (1u << (corr_bits-1)))
    {
      corr_bits--;
    }
		// the corrector must fall into this interval
    corr_min = -((I32)(corr_range/2));
  	corr_max = corr_min + corr_range - 1;
  }
  else if (bits && bits < 32)
  {
    corr_bits = bits;
    corr_range = 1u << bits;
		// the corrector must fall into this interval
    corr_min = -((I32)(corr_range/2));
  	corr_max = corr_min + corr_range - 1;
  }
	else
	{
    corr_bits = 32;
		corr_range = 0;
		// the corrector must fall into this interval
    corr_min = I32_MIN;
    corr_max = I32_MAX;
	}

  k = 0;

  mBits = 0;
  mCorrector = 0;
}